

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O2

void lightPlainFitting(structure_light *light)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pPVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  long lVar11;
  ostream *poVar12;
  char *pcVar13;
  float *pfVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  _InputArray local_2d0;
  Mat B;
  double *local_2a8;
  long *local_270;
  Mat A;
  undefined1 (*local_248) [16];
  long *local_210;
  _InputArray local_1f8 [14];
  _OutputArray local_98;
  Mat X;
  double *local_70;
  long *local_38;
  
  cv::Mat::zeros((int)local_1f8,3,3);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&A);
  cv::MatExpr::~MatExpr((MatExpr *)local_1f8);
  cv::Mat::zeros((int)local_1f8,3,1);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&B);
  cv::MatExpr::~MatExpr((MatExpr *)local_1f8);
  cv::Mat::zeros((int)local_1f8,3,1);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&X);
  cv::MatExpr::~MatExpr((MatExpr *)local_1f8);
  pPVar4 = (light->lightPlanePoint).
           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = ((long)(light->lightPlanePoint).
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4) / 0xc;
  auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar16._0_8_ = lVar11;
  auVar16._12_4_ = 0x45300000;
  lVar5 = *local_210;
  *(double *)(local_248[1] + lVar5 * 2) =
       (auVar16._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  pfVar14 = &pPVar4->z;
  while (bVar15 = lVar11 != 0, lVar11 = lVar11 + -1, bVar15) {
    uVar2 = ((Point3_<float> *)(pfVar14 + -2))->x;
    uVar3 = ((Point3_<float> *)(pfVar14 + -2))->y;
    *(double *)local_248[1] = *(double *)local_248[1] + (double)(float)uVar2;
    dVar10 = (double)((float)uVar3 * (float)uVar2) + *(double *)(*local_248 + 8);
    auVar7._8_4_ = SUB84(dVar10,0);
    auVar7._0_8_ = (double)((float)uVar2 * (float)uVar2) + *(double *)*local_248;
    auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *local_248 = auVar7;
    dVar10 = *(double *)((long)(*local_248 + lVar5) + 8) + (double)((float)uVar3 * (float)uVar3);
    auVar8._8_4_ = SUB84(dVar10,0);
    auVar8._0_8_ = *(double *)(*local_248 + lVar5) + (double)((float)uVar3 * (float)uVar2);
    auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *(undefined1 (*) [16])(*local_248 + lVar5) = auVar8;
    *(double *)(local_248[1] + lVar5) = (double)(float)uVar3 + *(double *)(local_248[1] + lVar5);
    dVar10 = *(double *)((long)(*local_248 + lVar5 * 2) + 8) + (double)(float)uVar3;
    auVar9._8_4_ = SUB84(dVar10,0);
    auVar9._0_8_ = *(double *)(*local_248 + lVar5 * 2) + (double)(float)uVar2;
    auVar9._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *(undefined1 (*) [16])(*local_248 + lVar5 * 2) = auVar9;
    fVar1 = *pfVar14;
    *local_2a8 = (double)((float)uVar2 * fVar1) + *local_2a8;
    lVar6 = *local_270;
    *(double *)((long)local_2a8 + lVar6) =
         (double)((float)uVar3 * fVar1) + *(double *)((long)local_2a8 + lVar6);
    *(double *)((long)local_2a8 + lVar6 * 2) =
         (double)fVar1 + *(double *)((long)local_2a8 + lVar6 * 2);
    pfVar14 = pfVar14 + 3;
  }
  local_1f8[0].sz.width = 0;
  local_1f8[0].sz.height = 0;
  local_1f8[0].flags = 0x1010000;
  local_2d0.sz.width = 0;
  local_2d0.sz.height = 0;
  local_98.super__InputArray.sz.width = 0;
  local_98.super__InputArray.sz.height = 0;
  local_2d0.flags = 0x1010000;
  local_98.super__InputArray.flags = 0x2010000;
  local_2d0.obj = (MatExpr *)&B;
  local_1f8[0].obj = (MatExpr *)&A;
  local_98.super__InputArray.obj = (MatExpr *)&X;
  cv::solve(local_1f8,&local_2d0,&local_98,0);
  poVar12 = std::operator<<((ostream *)&std::cout,"X:");
  cv::Formatter::get(&local_2d0,0);
  (**(code **)(*(long *)CONCAT44(local_2d0._4_4_,local_2d0.flags) + 0x10))
            (local_1f8,(long *)CONCAT44(local_2d0._4_4_,local_2d0.flags),&X);
  (**(code **)(*(long *)CONCAT44(local_1f8[0]._4_4_,local_1f8[0].flags) + 8))();
  while( true ) {
    pcVar13 = (char *)(*(code *)**(undefined8 **)CONCAT44(local_1f8[0]._4_4_,local_1f8[0].flags))();
    if (pcVar13 == (char *)0x0) break;
    std::operator<<(poVar12,pcVar13);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8[0].obj);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2d0.obj);
  poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
  std::endl<char,std::char_traits<char>>(poVar12);
  light->planeFormular[0] = -*local_70;
  lVar5 = *local_38;
  light->planeFormular[1] = -*(double *)((long)local_70 + lVar5);
  light->planeFormular[2] = 1.0;
  light->planeFormular[3] = *(double *)((long)local_70 + lVar5 * 2);
  cv::Mat::~Mat(&X);
  cv::Mat::~Mat(&B);
  cv::Mat::~Mat(&A);
  return;
}

Assistant:

void lightPlainFitting(structure_light &light)
{
    Mat A = Mat::zeros(3, 3, CV_64FC1);//定义拟合所需要的三个矩阵
    Mat B = Mat::zeros(3, 1, CV_64FC1);
    Mat X = Mat::zeros(3, 1, CV_64FC1);

    A.at<double>(2, 2) = light.lightPlanePoint.size();
    for (int i = 0; i < light.lightPlanePoint.size(); i++)
    {
        A.at<double>(0, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].x;
        A.at<double>(0, 1) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].y;
        A.at<double>(0, 2) += light.lightPlanePoint[i].x;
        A.at<double>(1, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].y;
        A.at<double>(1, 1) += light.lightPlanePoint[i].y*light.lightPlanePoint[i].y;
        A.at<double>(1, 2) += light.lightPlanePoint[i].y;
        A.at<double>(2, 0) += light.lightPlanePoint[i].x;
        A.at<double>(2, 1) += light.lightPlanePoint[i].y;
        B.at<double>(0, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].z;
        B.at<double>(1, 0) += light.lightPlanePoint[i].y*light.lightPlanePoint[i].z;
        B.at<double>(2, 0) += light.lightPlanePoint[i].z;
    }

    solve(A, B, X);

    cout << "X:" << X << endl << endl;

    light.planeFormular[0] = -X.at<double>(0, 0);//x
    light.planeFormular[1] = -X.at<double>(1, 0);//y
    light.planeFormular[2] = 1;//z
    light.planeFormular[3] = X.at<double>(2, 0);//常数项
}